

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

void __thiscall BCLog::Logger::DisableLogging(Logger *this)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    if (this->m_buffering == false) {
LAB_0040e412:
      __assert_fail("m_buffering",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                    ,0x70,"void BCLog::Logger::DisableLogging()");
    }
    if ((this->m_print_callbacks).
        super__List_base<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>_>
        ._M_impl._M_node.super__List_node_base._M_next !=
        (_List_node_base *)&this->m_print_callbacks) {
      __assert_fail("m_print_callbacks.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/logging.cpp"
                    ,0x71,"void BCLog::Logger::DisableLogging()");
    }
    pthread_mutex_unlock((pthread_mutex_t *)this);
    this->m_print_to_console = false;
    this->m_print_to_file = false;
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      StartLogging(this);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::__throw_system_error(iVar2);
    goto LAB_0040e412;
  }
  __stack_chk_fail();
}

Assistant:

void BCLog::Logger::DisableLogging()
{
    {
        StdLockGuard scoped_lock(m_cs);
        assert(m_buffering);
        assert(m_print_callbacks.empty());
    }
    m_print_to_file = false;
    m_print_to_console = false;
    StartLogging();
}